

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestVat>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestVat> *this,void *pointer)

{
  long lVar1;
  long lVar2;
  char (*in_RCX) [23];
  long lVar3;
  Exception exception;
  Array<char> local_4f8;
  Exception local_4e0;
  Exception local_350;
  Exception local_1c0;
  
  if (pointer != (void *)0x0) {
    Debug::makeDescription<char_const(&)[23]>
              ((String *)&local_4f8,(Debug *)"\"Network was destroyed.\"","Network was destroyed.",
               in_RCX);
    Exception::Exception
              (&local_4e0,FAILED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x102,(String *)&local_4f8);
    Array<char>::~Array(&local_4f8);
    lVar1 = *(long *)((long)pointer + 0x1c8);
    for (lVar3 = *(long *)((long)pointer + 0x1c0); lVar3 != lVar1; lVar3 = lVar3 + 0x10) {
      lVar2 = *(long *)(lVar3 + 8);
      Exception::Exception(&local_350,&local_4e0);
      Exception::Exception(&local_1c0,&local_350);
      ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
      rejectAll((ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
                 *)(lVar2 + 0x2a0),&local_1c0);
      Exception::~Exception(&local_1c0);
      NullableValue<kj::Exception>::emplace<kj::Exception>
                ((NullableValue<kj::Exception> *)(lVar2 + 0x108),&local_350);
      Own<kj::TaskSet,_std::nullptr_t>::dispose((Own<kj::TaskSet,_std::nullptr_t> *)(lVar2 + 0x2e8))
      ;
      Exception::~Exception(&local_350);
    }
    Exception::~Exception(&local_4e0);
    HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::~HashMap
              ((HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>
                *)((long)pointer + 0x248));
    Own<kj::Function<bool_(capnp::MessageBuilder_&)>::Iface,_std::nullptr_t>::dispose
              ((Own<kj::Function<bool_(capnp::MessageBuilder_&)>::Iface,_std::nullptr_t> *)
               ((long)pointer + 0x238));
    ProducerConsumerQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
    ::~ProducerConsumerQueue
              ((ProducerConsumerQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
                *)((long)pointer + 0x208));
    HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>
    ::~HashMap((HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>
                *)((long)pointer + 0x1c0));
    NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)((long)pointer + 0x28));
  }
  operator_delete(pointer,0x290);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }